

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

char * ossl_strerror(unsigned_long error,char *buf,size_t size)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  char *msg;
  size_t len;
  size_t size_local;
  char *buf_local;
  unsigned_long error_local;
  
  *buf = '\0';
  sVar1 = ossl_version(buf,size);
  len = size;
  size_local = (size_t)buf;
  if (sVar1 < size - 2) {
    pcVar2 = buf + sVar1;
    len = size - (sVar1 + 2);
    *pcVar2 = ':';
    size_local = (size_t)(pcVar2 + 2);
    pcVar2[1] = ' ';
    *(char *)size_local = '\0';
  }
  ERR_error_string_n(error,(char *)size_local,len);
  if (*(char *)size_local == '\0') {
    pcVar2 = "No error";
    if (error != 0) {
      pcVar2 = "Unknown error";
    }
    sVar3 = strlen(pcVar2);
    if (sVar3 < len) {
      strcpy((char *)size_local,pcVar2);
    }
  }
  return (char *)size_local;
}

Assistant:

static char *ossl_strerror(unsigned long error, char *buf, size_t size)
{
  size_t len;
  DEBUGASSERT(size);
  *buf = '\0';

  len = ossl_version(buf, size);
  DEBUGASSERT(len < (size - 2));
  if(len < (size - 2)) {
    buf += len;
    size -= (len + 2);
    *buf++ = ':';
    *buf++ = ' ';
    *buf = '\0';
  }

#if defined(OPENSSL_IS_BORINGSSL) || defined(OPENSSL_IS_AWSLC)
  ERR_error_string_n((uint32_t)error, buf, size);
#else
  ERR_error_string_n(error, buf, size);
#endif

  if(!*buf) {
    const char *msg = error ? "Unknown error" : "No error";
    if(strlen(msg) < size)
      strcpy(buf, msg);
  }

  return buf;
}